

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-select.c
# Opt level: O2

ssh_cipher * aes_select(ssh_cipheralg *alg)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  ssh_cipher *psVar5;
  long *plVar6;
  
  plVar6 = (long *)alg->extra;
  while( true ) {
    puVar1 = (undefined8 *)*plVar6;
    if (puVar1 == (undefined8 *)0x0) {
      __assert_fail("false && \"aes_select ran off the end of its list\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-select.c"
                    ,0x1b,"ssh_cipher *aes_select(const ssh_cipheralg *)");
    }
    puVar2 = (undefined8 *)puVar1[0xd];
    if (*(char *)puVar2[1] == '\0') {
      bVar4 = (*(code *)*puVar2)();
      puVar3 = (undefined1 *)puVar2[1];
      puVar3[1] = bVar4;
      *puVar3 = 1;
    }
    else {
      bVar4 = ((char *)puVar2[1])[1] & 1;
    }
    if (bVar4 != 0) break;
    plVar6 = plVar6 + 1;
  }
  psVar5 = (ssh_cipher *)(*(code *)*puVar1)();
  return psVar5;
}

Assistant:

static ssh_cipher *aes_select(const ssh_cipheralg *alg)
{
    const ssh_cipheralg *const *real_algs = (const ssh_cipheralg **)alg->extra;

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_cipheralg *alg = real_algs[i];
        const struct aes_extra *alg_extra =
            (const struct aes_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_cipher_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only AES, which is
     * always available. */
    unreachable("aes_select ran off the end of its list");
}